

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

DisplayItem *
pbrt::GetImageDisplayItem(string *title,Image *image,optional<pbrt::ImageChannelDesc> *channelDesc)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  Tuple2<pbrt::Point2,_int> this;
  optional *in_RCX;
  Image *in_RDX;
  DisplayItem *in_RDI;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  anon_class_336_2_a11d6aed getValues;
  value_type *in_stack_fffffffffffffca8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  optional<pbrt::ImageChannelDesc> *in_stack_fffffffffffffcc0;
  iterator in_stack_fffffffffffffcc8;
  int *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  allocator<char> *in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  string *psVar3;
  string *in_stack_fffffffffffffcf8;
  ImageChannelDesc *in_stack_fffffffffffffd00;
  Image *in_stack_fffffffffffffd08;
  Image *in_stack_fffffffffffffd38;
  Image *in_stack_fffffffffffffd40;
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *in_stack_fffffffffffffd80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd90;
  DisplayItem *in_stack_fffffffffffffd98;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffda0;
  string local_250 [32];
  int local_230;
  undefined1 local_22c;
  allocator<char> local_22b;
  allocator<char> local_22a;
  allocator<char> local_229;
  string *local_228;
  string local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  string *local_1c0;
  size_t local_1b8;
  Image *local_18;
  
  local_18 = in_RDX;
  pstd::optional<pbrt::ImageChannelDesc>::optional
            (in_stack_fffffffffffffcc0,
             (optional<pbrt::ImageChannelDesc> *)
             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  Image::Image(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x860ae6);
  bVar1 = pstd::optional::operator_cast_to_bool(in_RCX);
  if (bVar1) {
    pstd::optional<pbrt::ImageChannelDesc>::operator*((optional<pbrt::ImageChannelDesc> *)0x860b29);
    Image::ChannelNames_abi_cxx11_(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffcc0,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffcc0);
  }
  else {
    iVar2 = Image::NChannels((Image *)0x860bc5);
    if (iVar2 == 3) {
      local_22c = 1;
      local_228 = local_220;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
      local_228 = (string *)local_200;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
      in_stack_fffffffffffffd00 = (ImageChannelDesc *)local_1e0;
      local_228 = (string *)in_stack_fffffffffffffd00;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
      local_22c = 0;
      local_1c0 = local_220;
      local_1b8 = 3;
      __l._M_len = (size_type)in_stack_fffffffffffffcd0;
      __l._M_array = in_stack_fffffffffffffcc8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffcc0,__l);
      psVar3 = local_220;
      in_stack_fffffffffffffcf8 = (string *)&local_1c0;
      do {
        in_stack_fffffffffffffcf8 = in_stack_fffffffffffffcf8 + -0x20;
        std::__cxx11::string::~string(in_stack_fffffffffffffcf8);
      } while (in_stack_fffffffffffffcf8 != psVar3);
      std::allocator<char>::~allocator(&local_22b);
      std::allocator<char>::~allocator(&local_22a);
      std::allocator<char>::~allocator(&local_229);
    }
    else {
      local_230 = 0;
      while (in_stack_fffffffffffffcb8 = local_230,
            in_stack_fffffffffffffcbc = Image::NChannels((Image *)0x860e8e),
            in_stack_fffffffffffffcb8 < in_stack_fffffffffffffcbc) {
        StringPrintf<int&>(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        std::__cxx11::string::~string(local_250);
        local_230 = local_230 + 1;
      }
    }
  }
  this = (Tuple2<pbrt::Point2,_int>)Image::Resolution(local_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffd00,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffcf8);
  std::function<void(pbrt::Bounds2<int>,pstd::span<pstd::span<float>>)>::
  function<pbrt::GetImageDisplayItem(std::__cxx11::string_const&,pbrt::Image_const&,pstd::optional<pbrt::ImageChannelDesc>)::__0&,void>
            ((function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)
             in_stack_fffffffffffffcc0,
             (anon_class_336_2_a11d6aed *)
             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  DisplayItem::DisplayItem
            (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,(Point2i)in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  std::function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)>::~function
            ((function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)0x860fb2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffcc0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffcc0);
  GetImageDisplayItem(std::__cxx11::string_const&,pbrt::Image_const&,pstd::optional<pbrt::ImageChannelDesc>)
  ::$_0::~__0((anon_class_336_2_a11d6aed *)this);
  return in_RDI;
}

Assistant:

static DisplayItem GetImageDisplayItem(const std::string &title, const Image &image,
                                       pstd::optional<ImageChannelDesc> channelDesc) {
    auto getValues = [=](Bounds2i b, pstd::span<pstd::span<Float>> displayValues) {
        int offset = 0;
        for (Point2i p : b) {
            ImageChannelValues v =
                channelDesc ? image.GetChannels(p, *channelDesc) : image.GetChannels(p);
            for (int i = 0; i < v.size(); ++i)
                displayValues[i][offset] = v[i];
            ++offset;
        }
    };

    std::vector<std::string> channelNames;
    if (channelDesc)
        channelNames = image.ChannelNames(*channelDesc);
    else {
        if (image.NChannels() == 3)
            channelNames = {"R", "G", "B"};
        else
            for (int i = 0; i < image.NChannels(); ++i)
                channelNames.push_back(StringPrintf("channel %d", i));
    }

    return DisplayItem(title, image.Resolution(), channelNames, getValues);
}